

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O0

void __thiscall
Qentem::
HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
resize(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
       *this,SizeT new_size)

{
  SizeT SVar1;
  SizeT *pointer;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar2;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *value;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_38;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *storage;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *end;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *item;
  SizeT *ht;
  SizeT new_size_local;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  *this_local;
  
  pointer = getHashTable(this);
  end = Storage(this);
  SVar1 = Size(this);
  pHVar2 = end + SVar1;
  local_38 = allocate(this,new_size);
  setSize(this,0);
  for (; end < pHVar2; end = end + 1) {
    if (end->Hash != 0) {
      value = Memory::Move<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(end);
      Memory::Initialize<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>>(local_38,value)
      ;
      local_38 = local_38 + 1;
      this->index_ = this->index_ + 1;
    }
  }
  Memory::Deallocate(pointer);
  generateHash(this);
  return;
}

Assistant:

void resize(const SizeT new_size) {
        SizeT       *ht      = getHashTable();
        HItem       *item    = Storage();
        const HItem *end     = (item + Size());
        HItem       *storage = allocate(new_size);

        setSize(0);

        while (item < end) {
            if (item->Hash != 0) {
                Memory::Initialize(storage, Memory::Move(*item));
                ++storage;
                ++index_;
            }

            ++item;
        }

        Memory::Deallocate(ht);
        generateHash();
    }